

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void wake_pending_write(CManager_conflict cm,CMConnection conn,void *param)

{
  void *in_RDX;
  CManager in_RSI;
  int cond;
  
  remove_pending_write_callback((CMConnection)in_RSI,wake_pending_write,in_RDX);
  INT_CMCondition_signal(in_RSI,(int)((ulong)in_RDX >> 0x20));
  return;
}

Assistant:

static void
 wake_pending_write(CManager cm, CMConnection conn, void *param)
 {
     int cond = (int)(intptr_t)param;
     remove_pending_write_callback(conn, wake_pending_write, param);
     INT_CMCondition_signal(cm, cond);
 }